

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::ConsoleAssertionPrinter::ConsoleAssertionPrinter
          (ConsoleAssertionPrinter *this,ostream *_stream,AssertionStats *_stats,
          ColourImpl *colourImpl_,bool _printInfoMessages)

{
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  StringRef SVar4;
  char *local_1b0;
  size_type local_1a8;
  char *local_1a0;
  size_type local_198;
  char *local_190;
  size_type local_188;
  char *local_180;
  size_type local_178;
  char *local_170;
  size_type local_168;
  char *local_160;
  size_type local_158;
  char *local_150;
  size_type local_148;
  char *local_140;
  size_type local_138;
  char *local_130;
  size_type local_128;
  char *local_120;
  size_type local_118;
  char *local_110;
  size_type local_108;
  char *local_100;
  size_type local_f8;
  char *local_f0;
  size_type local_e8;
  char *local_e0;
  size_type local_d8;
  char *local_d0;
  size_type local_c8;
  char *local_c0;
  size_type local_b8;
  char *local_b0;
  size_type sStack_a8;
  char *local_a0;
  size_type local_98;
  char *local_90;
  size_type local_88;
  char *local_80;
  size_type local_78;
  char *local_70;
  size_type local_68;
  char *local_60;
  size_type local_58;
  char *local_50;
  size_type local_48;
  char *local_40;
  size_type local_38;
  bool _printInfoMessages_local;
  ColourImpl *colourImpl__local;
  AssertionStats *_stats_local;
  ostream *_stream_local;
  ConsoleAssertionPrinter *this_local;
  
  this->stream = _stream;
  this->stats = _stats;
  this->result = &_stats->assertionResult;
  this->colour = None;
  StringRef::StringRef(&this->passOrFail);
  StringRef::StringRef(&this->messageLabel);
  this->messages = &_stats->infoMessages;
  this->colourImpl = colourImpl_;
  this->printInfoMessages = _printInfoMessages;
  OVar2 = AssertionResult::getResultType(this->result);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      this->colour = Green;
      SVar4 = operator____sr("PASSED",6);
      local_40 = SVar4.m_start;
      (this->passOrFail).m_start = local_40;
      local_38 = SVar4.m_size;
      (this->passOrFail).m_size = local_38;
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (this->messages);
      if (sVar3 == 1) {
        SVar4 = operator____sr("with message",0xc);
        local_50 = SVar4.m_start;
        (this->messageLabel).m_start = local_50;
        local_48 = SVar4.m_size;
        (this->messageLabel).m_size = local_48;
      }
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (this->messages);
      if (sVar3 < 2) {
        return;
      }
      SVar4 = operator____sr("with messages",0xd);
      local_60 = SVar4.m_start;
      (this->messageLabel).m_start = local_60;
      local_58 = SVar4.m_size;
      (this->messageLabel).m_size = local_58;
      return;
    }
    if (OVar2 == Info) {
      SVar4 = operator____sr("info",4);
      local_130 = SVar4.m_start;
      (this->messageLabel).m_start = local_130;
      local_128 = SVar4.m_size;
      (this->messageLabel).m_size = local_128;
      return;
    }
    if (OVar2 == Warning) {
      SVar4 = operator____sr("warning",7);
      local_140 = SVar4.m_start;
      (this->messageLabel).m_start = local_140;
      local_138 = SVar4.m_size;
      (this->messageLabel).m_size = local_138;
      return;
    }
    if (OVar2 == ExplicitSkip) {
      this->colour = FileName;
      SVar4 = operator____sr("SKIPPED",7);
      local_180 = SVar4.m_start;
      (this->passOrFail).m_start = local_180;
      local_178 = SVar4.m_size;
      (this->passOrFail).m_size = local_178;
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (this->messages);
      if (sVar3 == 1) {
        SVar4 = operator____sr("explicitly with message",0x17);
        local_190 = SVar4.m_start;
        (this->messageLabel).m_start = local_190;
        local_188 = SVar4.m_size;
        (this->messageLabel).m_size = local_188;
      }
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (this->messages);
      if (sVar3 < 2) {
        return;
      }
      SVar4 = operator____sr("explicitly with messages",0x18);
      local_1a0 = SVar4.m_start;
      (this->messageLabel).m_start = local_1a0;
      local_198 = SVar4.m_size;
      (this->messageLabel).m_size = local_198;
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(this->result);
        if (bVar1) {
          this->colour = Green;
          SVar4 = operator____sr("FAILED - but was ok",0x13);
          local_70 = SVar4.m_start;
          (this->passOrFail).m_start = local_70;
          local_68 = SVar4.m_size;
          (this->passOrFail).m_size = local_68;
        }
        else {
          this->colour = BrightRed;
          SVar4 = operator____sr("FAILED",6);
          local_80 = SVar4.m_start;
          (this->passOrFail).m_start = local_80;
          local_78 = SVar4.m_size;
          (this->passOrFail).m_size = local_78;
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (this->messages);
        if (sVar3 == 1) {
          SVar4 = operator____sr("with message",0xc);
          local_90 = SVar4.m_start;
          (this->messageLabel).m_start = local_90;
          local_88 = SVar4.m_size;
          (this->messageLabel).m_size = local_88;
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (this->messages);
        if (sVar3 < 2) {
          return;
        }
        SVar4 = operator____sr("with messages",0xd);
        local_a0 = SVar4.m_start;
        (this->messageLabel).m_start = local_a0;
        local_98 = SVar4.m_size;
        (this->messageLabel).m_size = local_98;
        return;
      }
      if (OVar2 == ExplicitFailure) {
        SVar4 = operator____sr("FAILED",6);
        local_150 = SVar4.m_start;
        (this->passOrFail).m_start = local_150;
        local_148 = SVar4.m_size;
        (this->passOrFail).m_size = local_148;
        this->colour = BrightRed;
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (this->messages);
        if (sVar3 == 1) {
          SVar4 = operator____sr("explicitly with message",0x17);
          local_160 = SVar4.m_start;
          (this->messageLabel).m_start = local_160;
          local_158 = SVar4.m_size;
          (this->messageLabel).m_size = local_158;
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (this->messages);
        if (sVar3 < 2) {
          return;
        }
        SVar4 = operator____sr("explicitly with messages",0x18);
        local_170 = SVar4.m_start;
        (this->messageLabel).m_start = local_170;
        local_168 = SVar4.m_size;
        (this->messageLabel).m_size = local_168;
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          this->colour = BrightRed;
          SVar4 = operator____sr("FAILED",6);
          local_b0 = SVar4.m_start;
          sStack_a8 = SVar4.m_size;
          (this->passOrFail).m_start = local_b0;
          (this->passOrFail).m_size = sStack_a8;
          sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                            (this->messages);
          if (sVar3 == 0) {
            SVar4 = operator____sr("due to unexpected exception with ",0x21);
            local_c0 = SVar4.m_start;
            (this->messageLabel).m_start = local_c0;
            local_b8 = SVar4.m_size;
            (this->messageLabel).m_size = local_b8;
            return;
          }
          if (sVar3 != 1) {
            SVar4 = operator____sr("due to unexpected exception with messages",0x29);
            local_e0 = SVar4.m_start;
            (this->messageLabel).m_start = local_e0;
            local_d8 = SVar4.m_size;
            (this->messageLabel).m_size = local_d8;
            return;
          }
          SVar4 = operator____sr("due to unexpected exception with message",0x28);
          local_d0 = SVar4.m_start;
          (this->messageLabel).m_start = local_d0;
          local_c8 = SVar4.m_size;
          (this->messageLabel).m_size = local_c8;
          return;
        }
        if (OVar2 == DidntThrowException) {
          this->colour = BrightRed;
          SVar4 = operator____sr("FAILED",6);
          local_110 = SVar4.m_start;
          (this->passOrFail).m_start = local_110;
          local_108 = SVar4.m_size;
          (this->passOrFail).m_size = local_108;
          SVar4 = operator____sr("because no exception was thrown where one was expected",0x36);
          local_120 = SVar4.m_start;
          (this->messageLabel).m_start = local_120;
          local_118 = SVar4.m_size;
          (this->messageLabel).m_size = local_118;
          return;
        }
        if (OVar2 != FatalErrorCondition) {
          return;
        }
        this->colour = BrightRed;
        SVar4 = operator____sr("FAILED",6);
        local_f0 = SVar4.m_start;
        (this->passOrFail).m_start = local_f0;
        local_e8 = SVar4.m_size;
        (this->passOrFail).m_size = local_e8;
        SVar4 = operator____sr("due to a fatal error condition",0x1e);
        local_100 = SVar4.m_start;
        (this->messageLabel).m_start = local_100;
        local_f8 = SVar4.m_size;
        (this->messageLabel).m_size = local_f8;
        return;
      }
    }
  }
  SVar4 = operator____sr("** internal error **",0x14);
  local_1b0 = SVar4.m_start;
  (this->passOrFail).m_start = local_1b0;
  local_1a8 = SVar4.m_size;
  (this->passOrFail).m_size = local_1a8;
  this->colour = BrightRed;
  return;
}

Assistant:

ConsoleAssertionPrinter(std::ostream& _stream, AssertionStats const& _stats, ColourImpl* colourImpl_, bool _printInfoMessages)
        : stream(_stream),
        stats(_stats),
        result(_stats.assertionResult),
        colour(Colour::None),
        messages(_stats.infoMessages),
        colourImpl(colourImpl_),
        printInfoMessages(_printInfoMessages) {
        switch (result.getResultType()) {
        case ResultWas::Ok:
            colour = Colour::Success;
            passOrFail = "PASSED"_sr;
            //if( result.hasMessage() )
            if (messages.size() == 1)
                messageLabel = "with message"_sr;
            if (messages.size() > 1)
                messageLabel = "with messages"_sr;
            break;
        case ResultWas::ExpressionFailed:
            if (result.isOk()) {
                colour = Colour::Success;
                passOrFail = "FAILED - but was ok"_sr;
            } else {
                colour = Colour::Error;
                passOrFail = "FAILED"_sr;
            }
            if (messages.size() == 1)
                messageLabel = "with message"_sr;
            if (messages.size() > 1)
                messageLabel = "with messages"_sr;
            break;
        case ResultWas::ThrewException:
            colour = Colour::Error;
            passOrFail = "FAILED"_sr;
            // todo switch
            switch (messages.size()) { case 0:
                messageLabel = "due to unexpected exception with "_sr;
                break;
            case 1:
                messageLabel = "due to unexpected exception with message"_sr;
                break;
            default:
                messageLabel = "due to unexpected exception with messages"_sr;
                break;
            }
            break;
        case ResultWas::FatalErrorCondition:
            colour = Colour::Error;
            passOrFail = "FAILED"_sr;
            messageLabel = "due to a fatal error condition"_sr;
            break;
        case ResultWas::DidntThrowException:
            colour = Colour::Error;
            passOrFail = "FAILED"_sr;
            messageLabel = "because no exception was thrown where one was expected"_sr;
            break;
        case ResultWas::Info:
            messageLabel = "info"_sr;
            break;
        case ResultWas::Warning:
            messageLabel = "warning"_sr;
            break;
        case ResultWas::ExplicitFailure:
            passOrFail = "FAILED"_sr;
            colour = Colour::Error;
            if (messages.size() == 1)
                messageLabel = "explicitly with message"_sr;
            if (messages.size() > 1)
                messageLabel = "explicitly with messages"_sr;
            break;
        case ResultWas::ExplicitSkip:
            colour = Colour::Skip;
            passOrFail = "SKIPPED"_sr;
            if (messages.size() == 1)
                messageLabel = "explicitly with message"_sr;
            if (messages.size() > 1)
                messageLabel = "explicitly with messages"_sr;
            break;
            // These cases are here to prevent compiler warnings
        case ResultWas::Unknown:
        case ResultWas::FailureBit:
        case ResultWas::Exception:
            passOrFail = "** internal error **"_sr;
            colour = Colour::Error;
            break;
        }
    }